

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawStringDecal
          (PixelGameEngine *this,vf2d *pos,string *sText,Pixel col,vf2d *scale)

{
  uint uVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  float fVar6;
  float fVar7;
  anon_union_4_2_12391da5_for_Pixel_0 local_4c;
  vf2d local_48;
  vf2d local_40;
  vf2d local_38;
  
  sVar2 = sText->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (sText->_M_dataplus)._M_p;
    fVar7 = 0.0;
    sVar5 = 0;
    fVar6 = 0.0;
    local_4c = col.field_0;
    do {
      iVar4 = (int)pcVar3[sVar5];
      if (iVar4 == 10) {
        fVar7 = fVar7 + scale->y * 8.0;
        fVar6 = 0.0;
      }
      else {
        uVar1 = iVar4 - 0x11;
        if (-1 < (int)(iVar4 - 0x20U)) {
          uVar1 = iVar4 - 0x20U;
        }
        local_40.x = pos->x + fVar6;
        local_40.y = pos->y + fVar7;
        local_48.x = (float)(int)((iVar4 - (uVar1 & 0xfffffff0)) + -0x20) * 8.0;
        local_48.y = (float)((int)uVar1 >> 4) * 8.0;
        local_38.x = 8.0;
        local_38.y = 8.0;
        DrawPartialDecal(this,&local_40,this->fontDecal,&local_48,&local_38,scale,
                         (Pixel *)&local_4c.field_1);
        fVar6 = fVar6 + scale->x * 8.0;
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawStringDecal(const olc::vf2d &pos, const std::string &sText, const Pixel col, const olc::vf2d &scale)
	{
		olc::vf2d spos = {0.0f, 0.0f};
		for (auto c : sText)
		{
			if (c == '\n')
			{
				spos.x = 0;
				spos.y += 8.0f * scale.y;
			}
			else
			{
				int32_t ox = (c - 32) % 16;
				int32_t oy = (c - 32) / 16;
				DrawPartialDecal(pos + spos, fontDecal, {float(ox) * 8.0f, float(oy) * 8.0f}, {8.0f, 8.0f}, scale, col);
				spos.x += 8.0f * scale.x;
			}
		}
	}